

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_string_tests.cpp
# Opt level: O3

void __thiscall
iu_UnitStringTest_x_iutest_x_ToOctString_Test::Body
          (iu_UnitStringTest_x_iutest_x_ToOctString_Test *this)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  AssertionResult iutest_ar;
  type **in_stack_fffffffffffffcd8;
  AssertionResult local_320;
  AssertionHelper local_2f8;
  undefined1 local_2c8 [400];
  long *local_138 [2];
  long local_128 [2];
  long *local_118 [2];
  long local_108 [2];
  long *local_f8 [2];
  long local_e8 [2];
  long *local_d8 [2];
  long local_c8 [2];
  long *local_b8 [2];
  long local_a8 [2];
  long *local_98 [2];
  long local_88 [2];
  long *local_78 [2];
  long local_68 [2];
  long *local_58 [2];
  long local_48 [2];
  int local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  local_2c8._0_4_ = 0x303030;
  local_58[0] = local_48;
  sVar2 = strlen(local_2c8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,local_2c8,local_2c8 + sVar2);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&local_320,(internal *)"\"000\"","::iutest::detail::ToOctString< ::iutest::UInt8 >(0)",
             "000",(char *)local_58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffcd8);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  if (local_320.m_result == false) {
    memset((iu_global_format_stringstream *)local_2c8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_2c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f8,local_320.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffcdf);
    local_2f8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_2f8.m_part_result.super_iuCodeMessage.m_line = 0xd7;
    local_2f8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_2f8,(Fixed *)local_2c8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_2f8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_2f8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_2c8);
    std::ios_base::~ios_base((ios_base *)(local_2c8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320.m_message._M_dataplus._M_p != &local_320.m_message.field_2) {
    operator_delete(local_320.m_message._M_dataplus._M_p,
                    local_320.m_message.field_2._M_allocated_capacity + 1);
  }
  local_2c8._0_4_ = 0x30303030;
  local_2c8[4] = 0x30;
  local_2c8._5_2_ = 0x30;
  local_78[0] = local_68;
  sVar2 = strlen(local_2c8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,local_2c8,local_2c8 + sVar2);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&local_320,(internal *)"\"000000\"",
             "::iutest::detail::ToOctString< ::iutest::UInt16 >(0)","000000",(char *)local_78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffcd8);
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if (local_320.m_result == false) {
    memset((iu_global_format_stringstream *)local_2c8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_2c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f8,local_320.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffcdf);
    local_2f8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_2f8.m_part_result.super_iuCodeMessage.m_line = 0xd8;
    local_2f8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_2f8,(Fixed *)local_2c8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_2f8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_2f8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_2c8);
    std::ios_base::~ios_base((ios_base *)(local_2c8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320.m_message._M_dataplus._M_p != &local_320.m_message.field_2) {
    operator_delete(local_320.m_message._M_dataplus._M_p,
                    local_320.m_message.field_2._M_allocated_capacity + 1);
  }
  local_2c8._0_4_ = 0x30303030;
  local_2c8[4] = 0x30;
  local_2c8._5_2_ = 0x3030;
  local_2c8[7] = 0x30;
  local_2c8[8] = 0x30;
  local_2c8._9_2_ = 0x3030;
  local_2c8[0xb] = 0;
  local_98[0] = local_88;
  sVar2 = strlen(local_2c8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,local_2c8,local_2c8 + sVar2);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&local_320,(internal *)"\"00000000000\"",
             "::iutest::detail::ToOctString< ::iutest::UInt32 >(0)","00000000000",(char *)local_98,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffcd8);
  if (local_98[0] != local_88) {
    operator_delete(local_98[0],local_88[0] + 1);
  }
  if (local_320.m_result == false) {
    memset((iu_global_format_stringstream *)local_2c8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_2c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f8,local_320.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffcdf);
    local_2f8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_2f8.m_part_result.super_iuCodeMessage.m_line = 0xd9;
    local_2f8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_2f8,(Fixed *)local_2c8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_2f8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_2f8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_2c8);
    std::ios_base::~ios_base((ios_base *)(local_2c8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320.m_message._M_dataplus._M_p != &local_320.m_message.field_2) {
    operator_delete(local_320.m_message._M_dataplus._M_p,
                    local_320.m_message.field_2._M_allocated_capacity + 1);
  }
  local_2c8[0x10] = 0x30;
  local_2c8._17_5_ = 0x3030303030;
  local_2c8._0_4_ = 0x30303030;
  local_2c8[4] = 0x30;
  local_2c8._5_2_ = 0x3030;
  local_2c8[7] = 0x30;
  local_2c8[8] = 0x30;
  local_2c8._9_2_ = 0x3030;
  local_2c8[0xb] = 0x30;
  local_2c8._12_2_ = 0x3030;
  local_2c8[0xe] = 0x30;
  local_2c8[0xf] = 0x30;
  local_2c8[0x16] = 0;
  local_b8[0] = local_a8;
  sVar2 = strlen(local_2c8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,local_2c8,local_2c8 + sVar2);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&local_320,(internal *)"\"0000000000000000000000\"",
             "::iutest::detail::ToOctString< ::iutest::UInt64 >(0)","0000000000000000000000",
             (char *)local_b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffcd8);
  if (local_b8[0] != local_a8) {
    operator_delete(local_b8[0],local_a8[0] + 1);
  }
  if (local_320.m_result == false) {
    memset((iu_global_format_stringstream *)local_2c8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_2c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f8,local_320.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffcdf);
    local_2f8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_2f8.m_part_result.super_iuCodeMessage.m_line = 0xda;
    local_2f8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_2f8,(Fixed *)local_2c8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_2f8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_2f8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_2c8);
    std::ios_base::~ios_base((ios_base *)(local_2c8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320.m_message._M_dataplus._M_p != &local_320.m_message.field_2) {
    operator_delete(local_320.m_message._M_dataplus._M_p,
                    local_320.m_message.field_2._M_allocated_capacity + 1);
  }
  local_2c8._0_4_ = 0x37373731;
  local_2c8[4] = 0x37;
  local_2c8._5_2_ = 0x3737;
  local_2c8[7] = 0x37;
  local_2c8[8] = 0x37;
  local_2c8._9_2_ = 0x3737;
  local_2c8[0xb] = 0x37;
  local_2c8._12_2_ = 0x3737;
  local_2c8[0xe] = 0x37;
  local_2c8[0xf] = 0x37;
  local_2c8[0x10] = 0x37;
  local_2c8._17_5_ = 0x3737373737;
  local_2c8[0x16] = 0;
  local_d8[0] = local_c8;
  sVar2 = strlen(local_2c8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,local_2c8,local_2c8 + sVar2);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&local_320,(internal *)"\"1777777777777777777777\"",
             "::iutest::detail::ToOctString< ::iutest::Int64 >(-1)","1777777777777777777777",
             (char *)local_d8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffcd8);
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0],local_c8[0] + 1);
  }
  if (local_320.m_result == false) {
    memset((iu_global_format_stringstream *)local_2c8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_2c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f8,local_320.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffcdf);
    local_2f8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_2f8.m_part_result.super_iuCodeMessage.m_line = 0xdb;
    local_2f8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_2f8,(Fixed *)local_2c8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_2f8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_2f8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_2c8);
    std::ios_base::~ios_base((ios_base *)(local_2c8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320.m_message._M_dataplus._M_p != &local_320.m_message.field_2) {
    operator_delete(local_320.m_message._M_dataplus._M_p,
                    local_320.m_message.field_2._M_allocated_capacity + 1);
  }
  local_2c8[4] = 0;
  local_2c8._5_2_ = 0;
  local_2c8[7] = 0;
  local_2c8[8] = 0;
  local_2c8._9_2_ = 0;
  local_2c8[0xb] = 0;
  local_2c8._12_2_ = 0;
  local_2c8[0xe] = 0;
  local_2c8[0xf] = 0;
  local_2c8[0x10] = 0;
  local_2c8._17_5_ = 0;
  local_2c8._0_4_ = 0x30;
  lVar3 = 0x39;
  lVar4 = 0;
  do {
    auVar5._8_4_ = (int)lVar4;
    auVar5._0_8_ = lVar4;
    auVar5._12_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar5 = (auVar5 | ram0x0016e070) ^ _DAT_0016e080;
    if (auVar5._4_4_ == -0x80000000 && auVar5._0_4_ < -0x7fffffeb) {
      local_2c8[lVar4 + 1] = (byte)(0x7fffffffffffffff >> ((byte)lVar3 + 3 & 0x3f)) & 7 | 0x30;
      local_2c8[lVar4 + 2] = (byte)(0x7fffffffffffffff >> ((byte)lVar3 & 0x3f)) & 7 | 0x30;
    }
    lVar4 = lVar4 + 2;
    lVar3 = lVar3 + -6;
  } while (lVar3 != -9);
  local_38 = -0x80000000;
  uStack_34 = 0x80000000;
  uStack_30 = 0x80000000;
  uStack_2c = 0x80000000;
  local_2c8[0x16] = 0;
  local_f8[0] = local_e8;
  sVar2 = strlen(local_2c8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,local_2c8,local_2c8 + sVar2);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&local_320,(internal *)"\"0777777777777777777777\"",
             "::iutest::detail::ToOctString< ::iutest::Int64 >((9223372036854775807L))",
             "0777777777777777777777",(char *)local_f8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffcd8);
  if (local_f8[0] != local_e8) {
    operator_delete(local_f8[0],local_e8[0] + 1);
  }
  if (local_320.m_result == false) {
    memset((iu_global_format_stringstream *)local_2c8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_2c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f8,local_320.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffcdf);
    local_2f8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_2f8.m_part_result.super_iuCodeMessage.m_line = 0xdd;
    local_2f8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_2f8,(Fixed *)local_2c8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_2f8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_2f8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_2c8);
    std::ios_base::~ios_base((ios_base *)(local_2c8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320.m_message._M_dataplus._M_p != &local_320.m_message.field_2) {
    operator_delete(local_320.m_message._M_dataplus._M_p,
                    local_320.m_message.field_2._M_allocated_capacity + 1);
  }
  iVar1 = local_38;
  local_2c8[4] = 0;
  local_2c8._5_2_ = 0;
  local_2c8[7] = 0;
  local_2c8[8] = 0;
  local_2c8._9_2_ = 0;
  local_2c8[0xb] = 0;
  local_2c8._12_2_ = 0;
  local_2c8[0xe] = 0;
  local_2c8[0xf] = 0;
  local_2c8[0x10] = 0;
  local_2c8._17_5_ = 0;
  local_2c8._0_4_ = 0x31;
  lVar3 = 0x39;
  lVar4 = 0;
  do {
    auVar6._8_4_ = (int)lVar4;
    auVar6._0_8_ = lVar4;
    auVar6._12_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar5 = (auVar6 | ram0x0016e070) ^ _DAT_0016e080;
    if (auVar5._4_4_ == iVar1 && auVar5._0_4_ < -0x7fffffeb) {
      local_2c8[lVar4 + 1] = (byte)(-0x8000000000000000 >> ((byte)lVar3 + 3 & 0x3f)) & 6 | 0x30;
      local_2c8[lVar4 + 2] = (byte)(-0x8000000000000000 >> ((byte)lVar3 & 0x3f)) & 7 | 0x30;
    }
    lVar4 = lVar4 + 2;
    lVar3 = lVar3 + -6;
  } while (lVar3 != -9);
  local_2c8[0x16] = 0;
  local_118[0] = local_108;
  sVar2 = strlen(local_2c8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,local_2c8,local_2c8 + sVar2);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&local_320,(internal *)"\"1000000000000000000000\"",
             "::iutest::detail::ToOctString< ::iutest::Int64 >((-9223372036854775807L-1))",
             "1000000000000000000000",(char *)local_118,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffcd8);
  if (local_118[0] != local_108) {
    operator_delete(local_118[0],local_108[0] + 1);
  }
  if (local_320.m_result == false) {
    memset((iu_global_format_stringstream *)local_2c8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_2c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f8,local_320.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffcdf);
    local_2f8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_2f8.m_part_result.super_iuCodeMessage.m_line = 0xde;
    local_2f8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_2f8,(Fixed *)local_2c8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_2f8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_2f8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_2c8);
    std::ios_base::~ios_base((ios_base *)(local_2c8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320.m_message._M_dataplus._M_p != &local_320.m_message.field_2) {
    operator_delete(local_320.m_message._M_dataplus._M_p,
                    local_320.m_message.field_2._M_allocated_capacity + 1);
  }
  local_2c8._0_4_ = 0x373733;
  local_138[0] = local_128;
  sVar2 = strlen(local_2c8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,local_2c8,local_2c8 + sVar2);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&local_320,(internal *)"\"377\"",
             "::iutest::detail::ToOctString< ::iutest::UInt8 >(0377u)","377",(char *)local_138,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffcd8);
  if (local_138[0] != local_128) {
    operator_delete(local_138[0],local_128[0] + 1);
  }
  if (local_320.m_result == false) {
    memset((iu_global_format_stringstream *)local_2c8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_2c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f8,local_320.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffcdf);
    local_2f8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_2f8.m_part_result.super_iuCodeMessage.m_line = 0xe0;
    local_2f8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_2f8,(Fixed *)local_2c8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_2f8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_2f8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_2c8);
    std::ios_base::~ios_base((ios_base *)(local_2c8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320.m_message._M_dataplus._M_p != &local_320.m_message.field_2) {
    operator_delete(local_320.m_message._M_dataplus._M_p,
                    local_320.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST(UnitStringTest, ToOctString)
{
    IUTEST_EXPECT_STREQ(                   "000", ::iutest::detail::ToOctString< ::iutest::UInt8  >(0));
    IUTEST_EXPECT_STREQ(                "000000", ::iutest::detail::ToOctString< ::iutest::UInt16 >(0));
    IUTEST_EXPECT_STREQ(           "00000000000", ::iutest::detail::ToOctString< ::iutest::UInt32 >(0));
    IUTEST_EXPECT_STREQ("0000000000000000000000", ::iutest::detail::ToOctString< ::iutest::UInt64 >(0));
    IUTEST_EXPECT_STREQ("1777777777777777777777", ::iutest::detail::ToOctString< ::iutest::Int64 >(-1));
#if defined(INT64_MAX)
    IUTEST_EXPECT_STREQ("0777777777777777777777", ::iutest::detail::ToOctString< ::iutest::Int64 >(INT64_MAX));
    IUTEST_EXPECT_STREQ("1000000000000000000000", ::iutest::detail::ToOctString< ::iutest::Int64 >(INT64_MIN));
#endif
    IUTEST_EXPECT_STREQ(                   "377", ::iutest::detail::ToOctString< ::iutest::UInt8  >(0377u));
}